

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString StringFrom(void *value)

{
  size_t extraout_RDX;
  SimpleString SVar1;
  SimpleString local_30;
  SimpleString local_20;
  
  SimpleString::SimpleString(&local_20,"0x");
  HexStringFrom((cpputest_ulonglong)&local_30);
  SimpleString::operator+((SimpleString *)value,&local_20);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_20);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)value;
  return SVar1;
}

Assistant:

SimpleString StringFrom(const void* value)
{
    return SimpleString("0x") + HexStringFrom(value);
}